

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface.cpp
# Opt level: O2

double __thiscall Interface::log(Interface *this,double __x)

{
  ostream *poVar1;
  string *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  
  poVar1 = std::operator<<((ostream *)&this->logout,in_RSI);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (this->if_file != false) {
    return extraout_XMM0_Qa;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,in_RSI);
  std::endl<char,std::char_traits<char>>(poVar1);
  return extraout_XMM0_Qa_00;
}

Assistant:

void Interface::log(string s) {
    logout << s << endl;
    if (!if_file)
        cout << s << endl;
}